

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_checkpoint_state.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnCheckpointState::FlushSegment
          (ColumnCheckpointState *this,
          unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
          *segment,BufferHandle *handle,idx_t segment_size)

{
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_20;
  
  BufferHandle::Destroy(handle);
  local_20._M_head_impl =
       (segment->
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (segment->super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>).
  _M_t.super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  (*this->_vptr_ColumnCheckpointState[3])(this,&local_20,segment_size);
  _Var1._M_head_impl = local_20._M_head_impl;
  if (local_20._M_head_impl != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_20._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  return;
}

Assistant:

void ColumnCheckpointState::FlushSegment(unique_ptr<ColumnSegment> segment, BufferHandle handle, idx_t segment_size) {
	handle.Destroy();
	FlushSegmentInternal(std::move(segment), segment_size);
}